

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DS_STATUS ds_entry_remove(DsListEntry **entryAdd)

{
  DsListEntry *__ptr;
  DsListEntry *entry;
  DsListEntry **entryAdd_local;
  
  if ((entryAdd == (DsListEntry **)0x0) || (*entryAdd == (DsListEntry *)0x0)) {
    entryAdd_local._4_4_ = DS_STATUS_NULL;
  }
  else {
    __ptr = *entryAdd;
    if ((__ptr->next == (DsListEntry *)0x0) && (__ptr->prev == (DsListEntry *)0x0)) {
      *entryAdd = (DsListEntry *)0x0;
    }
    else {
      if (__ptr->prev == (DsListEntry *)0x0) {
        *entryAdd = __ptr->next;
      }
      else {
        __ptr->prev->next = __ptr->next;
      }
      if (__ptr->next != (DsListEntry *)0x0) {
        __ptr->next->prev = __ptr->prev;
      }
    }
    free(__ptr);
    entryAdd_local._4_4_ = DS_STATUS_OK;
  }
  return entryAdd_local._4_4_;
}

Assistant:

static DS_STATUS ds_entry_remove(DsListEntry **entryAdd)
{
    if (NULL == entryAdd || NULL == *entryAdd)
        return DS_STATUS_NULL;
    DsListEntry *entry = *entryAdd;
    if (NULL == entry->next && NULL == entry->prev)
        *entryAdd = NULL;
    else
    {
        if (entry->prev)
            entry->prev->next = entry->next;
        else
            *entryAdd = entry->next;

        if (entry->next)
            entry->next->prev = entry->prev;
    }
    free(entry);
    return DS_STATUS_OK;
}